

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2>
::ReadLinearExpr<TestNLHandler2::LinearExprHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler2>
           *this,int num_terms)

{
  BinaryReader<mp::internal::IdentityConverter> *this_00;
  
  if (0 < num_terms) {
    do {
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars);
      this_00 = this->reader_;
      (this_00->super_BinaryReaderBase).super_ReaderBase.token_ =
           (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
      BinaryReaderBase::Read(&this_00->super_BinaryReaderBase,8);
      num_terms = num_terms + -1;
    } while (num_terms != 0);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr(
    int num_terms, LinearHandler linear_expr) {
  for (int i = 0; i < num_terms; ++i) {
    // Variable index should be less than num_vars because common
    // expressions are not allowed in a linear expression.
    int var_index = ReadUInt(header_.num_vars);
    double coef = reader_.ReadDouble();
    reader_.ReadTillEndOfLine();
    linear_expr.AddTerm(var_index, coef);
  }
}